

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

QString * __thiscall
QtPrivate::QCalendarDateValidator::currentText
          (QString *__return_storage_ptr__,QCalendarDateValidator *this,undefined8 param_3)

{
  uint uVar1;
  pointer pSVar2;
  pointer pSVar3;
  const_reference pvVar4;
  ulong uVar5;
  size_type __n;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar1 = (uint)(this->m_separators).d.size;
  pSVar2 = (this->m_tokens).
           super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pSVar3 = (this->m_tokens).
           super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = 0;
  }
  for (__n = 0; uVar5 != __n; __n = __n + 1) {
    QString::append((QString *)__return_storage_ptr__);
    if ((long)__n < (long)(int)((ulong)((long)pSVar2 - (long)pSVar3) >> 4)) {
      pvVar4 = std::vector<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>::
               operator[](&this->m_tokens,__n);
      if (__n == (uint)this->m_currentToken) {
        (*pvVar4->validator->_vptr_QCalendarDateSectionValidator[5])(&local_50);
      }
      else {
        (*pvVar4->validator->_vptr_QCalendarDateSectionValidator[6])
                  (&local_50,pvVar4->validator,(this->m_currentDate).jd,param_3,
                   (ulong)(uint)pvVar4->repeat);
      }
      QString::append((QString *)__return_storage_ptr__);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCalendarDateValidator::currentText(QCalendar cal) const
{
    QString str;
    const int numSeps = m_separators.size();
    const int numTokens = int(m_tokens.size());
    for (int i = 0; i < numSeps; ++i) {
        str += m_separators.at(i);
        if (i < numTokens) {
            const SectionToken &token = m_tokens[i];
            if (i == m_currentToken)
                str += token.validator->text();
            else
                str += token.validator->text(m_currentDate, cal, token.repeat);
        }
    }
    return str;
}